

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueRelations.cpp
# Opt level: O1

Relations __thiscall dg::vr::ValueRelations::_between(ValueRelations *this,V lt,size_t rt)

{
  _Base_bitset<1UL> *p_Var1;
  _Base_bitset<1UL> _Var2;
  pair<unsigned_long,_std::reference_wrapper<const_dg::vr::Bucket>_> *pair;
  pointer ppVar3;
  Handle lt_00;
  
  ppVar3 = (this->graph).borderBuckets.
           super__Vector_base<std::pair<unsigned_long,_std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<unsigned_long,_std::reference_wrapper<const_dg::vr::Bucket>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  do {
    if (ppVar3 == (this->graph).borderBuckets.
                  super__Vector_base<std::pair<unsigned_long,_std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<unsigned_long,_std::reference_wrapper<const_dg::vr::Bucket>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      lt_00 = (Handle)0x0;
LAB_0012c0ff:
      if (lt_00 == (Handle)0x0) {
        _Var2._M_w = 0;
      }
      else {
        _between(this,lt_00,lt);
        p_Var1 = (_Base_bitset<1UL> *)dg::vr::Relations::invert();
        _Var2._M_w = p_Var1->_M_w;
      }
      return (Relations)_Var2._M_w;
    }
    if (ppVar3->first == rt) {
      lt_00 = (ppVar3->second)._M_data;
      goto LAB_0012c0ff;
    }
    ppVar3 = ppVar3 + 1;
  } while( true );
}

Assistant:

Relations ValueRelations::_between(V lt, size_t rt) const {
    HandlePtr mH = getBorderH(rt);
    return mH ? _between(lt, *mH) : Relations();
}